

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

void empty_opendir_cb(uv_fs_t *req)

{
  char *__s1;
  int iVar1;
  undefined8 uVar2;
  uv_fs_t *puVar3;
  void *unaff_RBX;
  void *pvVar4;
  uv_fs_t *puVar5;
  long lVar6;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_988 [448];
  uv_fs_t *puStack_7c8;
  long lStack_7b8;
  long lStack_7b0;
  uv_fs_t *apuStack_7a8 [56];
  undefined8 auStack_5e8 [56];
  undefined8 auStack_428 [11];
  uv_fs_t *puStack_3d0;
  undefined1 auStack_268 [448];
  uv_fs_t *puStack_a8;
  undefined1 auStack_58 [56];
  code *pcStack_20;
  void *local_18;
  ssize_t local_10;
  
  pvVar4 = opendir_req.ptr;
  if (req == &opendir_req) {
    local_10 = (ssize_t)opendir_req.fs_type;
    local_18 = (void *)0x1f;
    if (local_10 != 0x1f) goto LAB_0018b933;
    local_10 = opendir_req.result;
    local_18 = (void *)0x0;
    if (opendir_req.result != 0) goto LAB_0018b940;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0018b94d;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)pvVar4 + 8) = 1;
    pcStack_20 = (code *)0x18b8e3;
    uVar2 = uv_default_loop();
    pcStack_20 = (code *)0x18b8fc;
    iVar1 = uv_fs_readdir(uVar2,&readdir_req,pvVar4,empty_readdir_cb);
    local_10 = (ssize_t)iVar1;
    local_18 = (void *)0x0;
    if (local_10 == 0) {
      pcStack_20 = (code *)0x18b922;
      uv_fs_req_cleanup(&opendir_req);
      empty_opendir_cb_count = empty_opendir_cb_count + 1;
      return;
    }
  }
  else {
    pcStack_20 = (code *)0x18b933;
    empty_opendir_cb_cold_1();
LAB_0018b933:
    pcStack_20 = (code *)0x18b940;
    empty_opendir_cb_cold_2();
LAB_0018b940:
    pcStack_20 = (code *)0x18b94d;
    empty_opendir_cb_cold_3();
    pvVar4 = unaff_RBX;
LAB_0018b94d:
    pcStack_20 = (code *)0x18b952;
    empty_opendir_cb_cold_5();
  }
  pcStack_20 = run_test_fs_readdir_non_existing_dir;
  empty_opendir_cb_cold_4();
  auStack_58._32_8_ = (void *)0x18b97d;
  pcStack_20 = (code *)pvVar4;
  memset(&opendir_req,0xdb,0x1c0);
  auStack_58._32_8_ = (void *)0x18b982;
  uVar2 = uv_default_loop();
  auStack_58._32_8_ = (void *)0x18b996;
  iVar1 = uv_fs_opendir(uVar2,&opendir_req,"./non-existing-dir/",0);
  auStack_58._48_8_ = SEXT48(iVar1);
  auStack_58._40_8_ = (void *)0xfffffffffffffffe;
  if ((void *)auStack_58._48_8_ == (void *)0xfffffffffffffffe) {
    auStack_58._48_8_ = SEXT48(opendir_req.fs_type);
    auStack_58._40_8_ = (void *)0x1f;
    if ((void *)auStack_58._48_8_ != (void *)0x1f) goto LAB_0018bb3e;
    auStack_58._48_8_ = opendir_req.result;
    auStack_58._40_8_ = (void *)0xfffffffffffffffe;
    if (opendir_req.result != -2) goto LAB_0018bb4b;
    if (opendir_req.ptr != (void *)0x0) goto LAB_0018bb58;
    auStack_58._32_8_ = (void *)0x18ba19;
    uv_fs_req_cleanup(&opendir_req);
    auStack_58._32_8_ = (void *)0x18ba2b;
    memset(&opendir_req,0xdb,0x1c0);
    auStack_58._32_8_ = (void *)0x18ba30;
    uVar2 = uv_default_loop();
    auStack_58._32_8_ = (void *)0x18ba49;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"./non-existing-dir/",non_existing_opendir_cb);
    auStack_58._48_8_ = SEXT48(iVar1);
    auStack_58._40_8_ = (void *)0x0;
    if ((void *)auStack_58._48_8_ != (void *)0x0) goto LAB_0018bb5d;
    auStack_58._48_8_ = SEXT48(non_existing_opendir_cb_count);
    auStack_58._40_8_ = (void *)0x0;
    if ((void *)auStack_58._48_8_ != (void *)0x0) goto LAB_0018bb6a;
    auStack_58._32_8_ = (void *)0x18ba8f;
    uVar2 = uv_default_loop();
    auStack_58._32_8_ = (void *)0x18ba99;
    iVar1 = uv_run(uVar2,0);
    auStack_58._48_8_ = SEXT48(iVar1);
    auStack_58._40_8_ = (void *)0x0;
    if ((void *)auStack_58._48_8_ != (void *)0x0) goto LAB_0018bb77;
    auStack_58._48_8_ = (void *)0x1;
    auStack_58._40_8_ = SEXT48(non_existing_opendir_cb_count);
    if ((void *)auStack_58._40_8_ != (void *)0x1) goto LAB_0018bb84;
    auStack_58._32_8_ = (void *)0x18badf;
    puVar3 = (uv_fs_t *)uv_default_loop();
    auStack_58._32_8_ = (void *)0x18baf3;
    uv_walk(puVar3,close_walk_cb,0);
    auStack_58._32_8_ = (void *)0x18bafd;
    uv_run(puVar3,0);
    auStack_58._48_8_ = (void *)0x0;
    auStack_58._32_8_ = (void *)0x18bb0b;
    uVar2 = uv_default_loop();
    auStack_58._32_8_ = (void *)0x18bb13;
    iVar1 = uv_loop_close(uVar2);
    auStack_58._40_8_ = SEXT48(iVar1);
    if (auStack_58._48_8_ == auStack_58._40_8_) {
      auStack_58._32_8_ = (void *)0x18bb29;
      uv_library_shutdown();
      return;
    }
  }
  else {
    auStack_58._32_8_ = (void *)0x18bb3e;
    run_test_fs_readdir_non_existing_dir_cold_1();
LAB_0018bb3e:
    auStack_58._32_8_ = (void *)0x18bb4b;
    run_test_fs_readdir_non_existing_dir_cold_2();
LAB_0018bb4b:
    auStack_58._32_8_ = (void *)0x18bb58;
    run_test_fs_readdir_non_existing_dir_cold_3();
LAB_0018bb58:
    auStack_58._32_8_ = (void *)0x18bb5d;
    run_test_fs_readdir_non_existing_dir_cold_4();
LAB_0018bb5d:
    auStack_58._32_8_ = (void *)0x18bb6a;
    run_test_fs_readdir_non_existing_dir_cold_5();
LAB_0018bb6a:
    auStack_58._32_8_ = (void *)0x18bb77;
    run_test_fs_readdir_non_existing_dir_cold_6();
LAB_0018bb77:
    auStack_58._32_8_ = (void *)0x18bb84;
    run_test_fs_readdir_non_existing_dir_cold_7();
LAB_0018bb84:
    puVar3 = &opendir_req;
    auStack_58._32_8_ = (void *)0x18bb91;
    run_test_fs_readdir_non_existing_dir_cold_8();
  }
  puVar5 = (uv_fs_t *)(auStack_58 + 0x30);
  auStack_58._32_8_ = non_existing_opendir_cb;
  run_test_fs_readdir_non_existing_dir_cold_9();
  if (puVar5 == &opendir_req) {
    auStack_58._32_8_ = SEXT48(opendir_req.fs_type);
    auStack_58._24_8_ = (void *)0x1f;
    if ((code *)auStack_58._32_8_ != (code *)0x1f) goto LAB_0018bc18;
    auStack_58._32_8_ = opendir_req.result;
    auStack_58._24_8_ = (void *)0xfffffffffffffffe;
    if (opendir_req.result != -2) goto LAB_0018bc27;
    if (opendir_req.ptr == (void *)0x0) {
      auStack_58._8_8_ = (uv_loop_t *)0x18bc08;
      uv_fs_req_cleanup(&opendir_req);
      non_existing_opendir_cb_count = non_existing_opendir_cb_count + 1;
      return;
    }
  }
  else {
    auStack_58._8_8_ = (uv_loop_t *)0x18bc18;
    non_existing_opendir_cb_cold_1();
LAB_0018bc18:
    auStack_58._8_8_ = (uv_loop_t *)0x18bc27;
    non_existing_opendir_cb_cold_2();
LAB_0018bc27:
    auStack_58._8_8_ = (uv_loop_t *)0x18bc36;
    non_existing_opendir_cb_cold_3();
  }
  auStack_58._8_8_ = run_test_fs_readdir_file;
  non_existing_opendir_cb_cold_4();
  auStack_58._8_8_ = puVar3;
  memset(&opendir_req,0xdb,0x1c0);
  uVar2 = uv_default_loop();
  iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test/fixtures/empty_file",0);
  auStack_58._0_8_ = SEXT48(iVar1);
  if ((void *)auStack_58._0_8_ == (void *)0xffffffffffffffec) {
    auStack_58._0_8_ = SEXT48(opendir_req.fs_type);
    if ((void *)auStack_58._0_8_ != (void *)0x1f) goto LAB_0018be1a;
    auStack_58._0_8_ = opendir_req.result;
    if (opendir_req.result != -0x14) goto LAB_0018be27;
    if (opendir_req.ptr != (void *)0x0) goto LAB_0018be34;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1c0);
    uVar2 = uv_default_loop();
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test/fixtures/empty_file",file_opendir_cb);
    auStack_58._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_58._0_8_ != (void *)0x0) goto LAB_0018be39;
    auStack_58._0_8_ = SEXT48(file_opendir_cb_count);
    if ((void *)auStack_58._0_8_ != (void *)0x0) goto LAB_0018be46;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    auStack_58._0_8_ = SEXT48(iVar1);
    if ((void *)auStack_58._0_8_ != (void *)0x0) goto LAB_0018be53;
    auStack_58._0_8_ = (void *)0x1;
    if (file_opendir_cb_count != 1) goto LAB_0018be60;
    puVar3 = (uv_fs_t *)uv_default_loop();
    uv_walk(puVar3,close_walk_cb,0);
    uv_run(puVar3,0);
    auStack_58._0_8_ = (void *)0x0;
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if ((void *)auStack_58._0_8_ == (void *)(long)iVar1) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_readdir_file_cold_1();
LAB_0018be1a:
    run_test_fs_readdir_file_cold_2();
LAB_0018be27:
    run_test_fs_readdir_file_cold_3();
LAB_0018be34:
    run_test_fs_readdir_file_cold_4();
LAB_0018be39:
    run_test_fs_readdir_file_cold_5();
LAB_0018be46:
    run_test_fs_readdir_file_cold_6();
LAB_0018be53:
    run_test_fs_readdir_file_cold_7();
LAB_0018be60:
    puVar3 = &opendir_req;
    run_test_fs_readdir_file_cold_8();
  }
  puVar5 = (uv_fs_t *)auStack_58;
  run_test_fs_readdir_file_cold_9();
  if (puVar5 == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0018bef4;
    if (opendir_req.result != -0x14) goto LAB_0018bf03;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_0018bef4:
    file_opendir_cb_cold_2();
LAB_0018bf03:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_7c8 = (uv_fs_t *)0x18bf2d;
  puStack_a8 = puVar3;
  cleanup_test_files();
  puStack_7c8 = (uv_fs_t *)0x18bf32;
  uVar2 = uv_default_loop();
  puStack_7c8 = (uv_fs_t *)0x18bf51;
  iVar1 = uv_fs_mkdir(uVar2,auStack_268,"test_dir",0x1ed,0);
  apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
  auStack_428[0] = 0;
  if (apuStack_7a8[0] == (uv_fs_t *)0x0) {
    puStack_7c8 = (uv_fs_t *)0x18bf7c;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18bfa1;
    iVar1 = uv_fs_open(uVar2,auStack_428,"test_dir/file1",0x41,0x180,0);
    puVar5 = puStack_3d0;
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    auStack_5e8[0] = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c588;
    apuStack_7a8[0] = puStack_3d0;
    auStack_5e8[0] = 0;
    if ((long)puStack_3d0 < 0) goto LAB_0018c59a;
    puStack_7c8 = (uv_fs_t *)0x18c000;
    uv_fs_req_cleanup(auStack_428);
    puStack_7c8 = (uv_fs_t *)0x18c005;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c019;
    iVar1 = uv_fs_close(uVar2,auStack_5e8,(ulong)puVar5 & 0xffffffff,0);
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c5ac;
    puStack_7c8 = (uv_fs_t *)0x18c046;
    uv_fs_req_cleanup(auStack_5e8);
    puStack_7c8 = (uv_fs_t *)0x18c04b;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c070;
    iVar1 = uv_fs_open(uVar2,auStack_428,"test_dir/file2",0x41,0x180,0);
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c5bb;
    apuStack_7a8[0] = puStack_3d0;
    lStack_7b8 = 0;
    puVar5 = puStack_3d0;
    if ((long)puStack_3d0 < 0) goto LAB_0018c5ca;
    puStack_7c8 = (uv_fs_t *)0x18c0c3;
    uv_fs_req_cleanup(auStack_428);
    puStack_7c8 = (uv_fs_t *)0x18c0c8;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c0dc;
    iVar1 = uv_fs_close(uVar2,auStack_5e8,(ulong)puStack_3d0 & 0xffffffff,0);
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c5d9;
    puStack_7c8 = (uv_fs_t *)0x18c109;
    uv_fs_req_cleanup(auStack_5e8);
    puStack_7c8 = (uv_fs_t *)0x18c10e;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c12d;
    iVar1 = uv_fs_mkdir(uVar2,auStack_268,"test_dir/test_subdir",0x1ed,0);
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c5e8;
    puStack_7c8 = (uv_fs_t *)0x18c15a;
    uv_fs_req_cleanup(auStack_268);
    puVar5 = &opendir_req;
    puStack_7c8 = (uv_fs_t *)0x18c173;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_7c8 = (uv_fs_t *)0x18c178;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c18c;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",0);
    puVar3 = (uv_fs_t *)opendir_req.ptr;
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c5f7;
    apuStack_7a8[0] = (uv_fs_t *)(long)opendir_req.fs_type;
    lStack_7b8 = 0x1f;
    if (apuStack_7a8[0] != (uv_fs_t *)0x1f) goto LAB_0018c606;
    apuStack_7a8[0] = (uv_fs_t *)opendir_req.result;
    lStack_7b8 = 0;
    if (opendir_req.result != 0) goto LAB_0018c615;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0018c624;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)puVar3 + 8) = 1;
    puStack_7c8 = (uv_fs_t *)0x18c224;
    uv_fs_req_cleanup(&opendir_req);
    puStack_7c8 = (uv_fs_t *)0x18c229;
    uVar2 = uv_default_loop();
    lVar6 = 0;
    puStack_7c8 = (uv_fs_t *)0x18c240;
    iVar1 = uv_fs_readdir(uVar2,&readdir_req,puVar3,0);
    if (iVar1 != 0) {
      lVar6 = 0;
      do {
        __s1 = dirents[0].name;
        puStack_7c8 = (uv_fs_t *)0x18c272;
        iVar1 = strcmp(dirents[0].name,"file1");
        if (iVar1 != 0) {
          puStack_7c8 = (uv_fs_t *)0x18c285;
          iVar1 = strcmp(__s1,"file2");
          if (iVar1 == 0) goto LAB_0018c29c;
          puStack_7c8 = (uv_fs_t *)0x18c294;
          iVar1 = strcmp(__s1,"test_subdir");
          if (iVar1 == 0) goto LAB_0018c29c;
LAB_0018c562:
          puStack_7c8 = (uv_fs_t *)0x18c567;
          run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0018c567:
          puStack_7c8 = (uv_fs_t *)0x18c576;
          run_test_fs_readdir_non_empty_dir_cold_12();
          goto LAB_0018c576;
        }
LAB_0018c29c:
        puStack_7c8 = (uv_fs_t *)0x18c2a7;
        iVar1 = strcmp(__s1,"test_subdir");
        if (iVar1 == 0) {
          apuStack_7a8[0] = (uv_fs_t *)(ulong)dirents[0].type;
          lStack_7b8 = 2;
          if (apuStack_7a8[0] == (uv_fs_t *)0x2) goto LAB_0018c2f4;
          goto LAB_0018c567;
        }
        apuStack_7a8[0] = (uv_fs_t *)(ulong)dirents[0].type;
        lStack_7b8 = 1;
        if (apuStack_7a8[0] != (uv_fs_t *)0x1) {
          puStack_7c8 = (uv_fs_t *)0x18c562;
          run_test_fs_readdir_non_empty_dir_cold_11();
          goto LAB_0018c562;
        }
LAB_0018c2f4:
        apuStack_7a8[0] = (uv_fs_t *)(ulong)dirents[0].type;
        puStack_7c8 = (uv_fs_t *)0x18c2fc;
        uv_fs_req_cleanup(&readdir_req);
        lVar6 = lVar6 + 1;
        puStack_7c8 = (uv_fs_t *)0x18c304;
        uVar2 = uv_default_loop();
        puStack_7c8 = (uv_fs_t *)0x18c314;
        iVar1 = uv_fs_readdir(uVar2,&readdir_req,puVar3,0);
      } while (iVar1 != 0);
    }
    apuStack_7a8[0] = (uv_fs_t *)0x3;
    lStack_7b8 = lVar6;
    if (lVar6 != 3) goto LAB_0018c629;
    puStack_7c8 = (uv_fs_t *)0x18c346;
    uv_fs_req_cleanup(&readdir_req);
    puStack_7c8 = (uv_fs_t *)0x18c35f;
    memset(&closedir_req,0xdb,0x1c0);
    puStack_7c8 = (uv_fs_t *)0x18c364;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c374;
    uv_fs_closedir(uVar2,&closedir_req,puVar3,0);
    apuStack_7a8[0] = (uv_fs_t *)closedir_req.result;
    lStack_7b8 = 0;
    if (closedir_req.result != 0) goto LAB_0018c638;
    puStack_7c8 = (uv_fs_t *)0x18c3a5;
    uv_fs_req_cleanup(&closedir_req);
    puVar3 = &opendir_req;
    puStack_7c8 = (uv_fs_t *)0x18c3be;
    memset(&opendir_req,0xdb,0x1c0);
    puStack_7c8 = (uv_fs_t *)0x18c3c3;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c3dc;
    iVar1 = uv_fs_opendir(uVar2,&opendir_req,"test_dir",non_empty_opendir_cb);
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c647;
    apuStack_7a8[0] = (uv_fs_t *)(long)non_empty_opendir_cb_count;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c656;
    apuStack_7a8[0] = (uv_fs_t *)(long)non_empty_closedir_cb_count;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c665;
    puStack_7c8 = (uv_fs_t *)0x18c44b;
    uVar2 = uv_default_loop();
    puStack_7c8 = (uv_fs_t *)0x18c455;
    iVar1 = uv_run(uVar2,0);
    apuStack_7a8[0] = (uv_fs_t *)(long)iVar1;
    lStack_7b8 = 0;
    if (apuStack_7a8[0] != (uv_fs_t *)0x0) goto LAB_0018c674;
    apuStack_7a8[0] = (uv_fs_t *)0x1;
    lStack_7b8 = (long)non_empty_opendir_cb_count;
    if (lStack_7b8 != 1) goto LAB_0018c683;
    apuStack_7a8[0] = (uv_fs_t *)0x1;
    lStack_7b8 = (long)non_empty_closedir_cb_count;
    if (lStack_7b8 == 1) {
      puStack_7c8 = (uv_fs_t *)0x18c4c4;
      uVar2 = uv_default_loop();
      puStack_7c8 = (uv_fs_t *)0x18c4dd;
      uv_fs_rmdir(uVar2,apuStack_7a8,"test_subdir",0);
      puStack_7c8 = (uv_fs_t *)0x18c4e5;
      uv_fs_req_cleanup(apuStack_7a8);
      puStack_7c8 = (uv_fs_t *)0x18c4ea;
      cleanup_test_files();
      puStack_7c8 = (uv_fs_t *)0x18c4ef;
      puVar3 = (uv_fs_t *)uv_default_loop();
      puStack_7c8 = (uv_fs_t *)0x18c503;
      uv_walk(puVar3,close_walk_cb,0);
      puStack_7c8 = (uv_fs_t *)0x18c50d;
      uv_run(puVar3,0);
      lStack_7b8 = 0;
      puStack_7c8 = (uv_fs_t *)0x18c51b;
      uVar2 = uv_default_loop();
      puStack_7c8 = (uv_fs_t *)0x18c523;
      iVar1 = uv_loop_close(uVar2);
      lStack_7b0 = (long)iVar1;
      if (lStack_7b8 == lStack_7b0) {
        puStack_7c8 = (uv_fs_t *)0x18c53f;
        uv_library_shutdown();
        return;
      }
      goto LAB_0018c6a1;
    }
  }
  else {
LAB_0018c576:
    puStack_7c8 = (uv_fs_t *)0x18c588;
    run_test_fs_readdir_non_empty_dir_cold_1();
LAB_0018c588:
    puVar5 = puVar3;
    puStack_7c8 = (uv_fs_t *)0x18c59a;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_0018c59a:
    puStack_7c8 = (uv_fs_t *)0x18c5ac;
    run_test_fs_readdir_non_empty_dir_cold_24();
LAB_0018c5ac:
    puStack_7c8 = (uv_fs_t *)0x18c5bb;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_0018c5bb:
    puStack_7c8 = (uv_fs_t *)0x18c5ca;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_0018c5ca:
    puStack_7c8 = (uv_fs_t *)0x18c5d9;
    run_test_fs_readdir_non_empty_dir_cold_23();
LAB_0018c5d9:
    puStack_7c8 = (uv_fs_t *)0x18c5e8;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_0018c5e8:
    puStack_7c8 = (uv_fs_t *)0x18c5f7;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_0018c5f7:
    puStack_7c8 = (uv_fs_t *)0x18c606;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_0018c606:
    puStack_7c8 = (uv_fs_t *)0x18c615;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_0018c615:
    puVar3 = puVar5;
    puStack_7c8 = (uv_fs_t *)0x18c624;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_0018c624:
    puStack_7c8 = (uv_fs_t *)0x18c629;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_0018c629:
    puStack_7c8 = (uv_fs_t *)0x18c638;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_0018c638:
    puStack_7c8 = (uv_fs_t *)0x18c647;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_0018c647:
    puStack_7c8 = (uv_fs_t *)0x18c656;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_0018c656:
    puStack_7c8 = (uv_fs_t *)0x18c665;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_0018c665:
    puStack_7c8 = (uv_fs_t *)0x18c674;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_0018c674:
    puStack_7c8 = (uv_fs_t *)0x18c683;
    run_test_fs_readdir_non_empty_dir_cold_18();
LAB_0018c683:
    puStack_7c8 = (uv_fs_t *)0x18c692;
    run_test_fs_readdir_non_empty_dir_cold_19();
  }
  puStack_7c8 = (uv_fs_t *)0x18c6a1;
  run_test_fs_readdir_non_empty_dir_cold_20();
LAB_0018c6a1:
  puStack_7c8 = (uv_fs_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_21();
  puStack_7c8 = puVar3;
  uv_fs_unlink(0,auStack_988,"test_dir/file1",0);
  uv_fs_req_cleanup(auStack_988);
  uv_fs_unlink(0,auStack_988,"test_dir/file2",0);
  uv_fs_req_cleanup(auStack_988);
  uv_fs_rmdir(0,auStack_988,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(auStack_988);
  uv_fs_rmdir(0,auStack_988,"test_dir",0);
  uv_fs_req_cleanup(auStack_988);
  return;
}

Assistant:

static void empty_opendir_cb(uv_fs_t* req) {
  uv_dir_t* dir;
  int r;

  ASSERT_PTR_EQ(req, &opendir_req);
  ASSERT_EQ(req->fs_type, UV_FS_OPENDIR);
  ASSERT_OK(req->result);
  ASSERT_NOT_NULL(req->ptr);
  dir = req->ptr;
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  r = uv_fs_readdir(uv_default_loop(),
                    &readdir_req,
                    dir,
                    empty_readdir_cb);
  ASSERT_OK(r);
  uv_fs_req_cleanup(req);
  ++empty_opendir_cb_count;
}